

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  reference pvVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  vector<BoxPoint,_std::allocator<BoxPoint>_> *this;
  undefined8 *in_R8;
  double dVar10;
  uint uVar11;
  Scalar_<double> *in_stack_fffffffffffffb78;
  vector<BoxPoint,_std::allocator<BoxPoint>_> predictedTrajectory;
  vector<BoxPoint,_std::allocator<BoxPoint>_> centers;
  _InputArray local_448;
  Matx<double,_4,_1> local_428 [3];
  vector<BoxPoint,_std::allocator<BoxPoint>_> initialTrajectory;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  int local_390;
  int local_38c;
  Rect rect;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  _Vector_base<BoxPoint,_std::allocator<BoxPoint>_> local_330;
  double local_318;
  double dStack_310;
  undefined8 local_308 [3];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  VideoCapture vid;
  Mat frame;
  string videoFile;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_228;
  Mat lastFrame;
  Mat thresh;
  Mat firstFrame;
  Mat frameDelta;
  Mat grayFrame;
  
  if (argc < 2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Requires 1 Argument");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&videoFile,argv[1],(allocator<char> *)&firstFrame);
    cv::VideoCapture::VideoCapture(&vid,(string *)&videoFile,0);
    cv::Mat::Mat(&firstFrame);
    cv::Mat::Mat(&frame);
    cv::Mat::Mat(&grayFrame);
    cv::Mat::Mat(&frameDelta);
    cv::Mat::Mat(&thresh);
    cv::Mat::Mat(&lastFrame);
    contours.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428[0].val[2] = 0.0;
    contours.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    contours.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428[0].val[0]._0_4_ = 0x2010000;
    local_428[0].val[1] = (double)&frame;
    cv::VideoCapture::read((_OutputArray *)&vid);
    cv::Mat::clone();
    cv::Mat::operator=(&lastFrame,(Mat *)local_428);
    cv::Mat::~Mat((Mat *)local_428);
    local_428[0].val[2] = 0.0;
    predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428[0].val[0]._0_4_ = 0x1010000;
    predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x2010000;
    predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&firstFrame;
    local_428[0].val[1] = (double)&frame;
    cv::cvtColor((cv *)local_428,(_InputArray *)&predictedTrajectory,(_OutputArray *)0x6,0,
                 (int)in_R8);
    local_428[0].val[2] = 0.0;
    local_428[0].val[0]._0_4_ = 0x1010000;
    predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x2010000;
    local_2e0 = 0x1500000015;
    predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&firstFrame;
    local_428[0].val[1] = (double)&firstFrame;
    cv::GaussianBlur(0,0,(_InputArray *)local_428);
    initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      iVar3 = (int)in_R8;
      local_428[0].val[2] = 0.0;
      local_428[0].val[0]._0_4_ = 0x2010000;
      local_428[0].val[1] = (double)&frame;
      cVar2 = cv::VideoCapture::read((_OutputArray *)&vid);
      if (cVar2 == '\0') break;
      cv::Mat::clone();
      cv::Mat::operator=(&lastFrame,(Mat *)local_428);
      cv::Mat::~Mat((Mat *)local_428);
      local_428[0].val[2] = 0.0;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_428[0].val[0]._0_4_ = 0x1010000;
      local_428[0].val[1] = (double)&frame;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x2010000;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&grayFrame;
      cv::cvtColor((cv *)local_428,(_InputArray *)&predictedTrajectory,(_OutputArray *)0x6,0,iVar3);
      local_428[0].val[2] = 0.0;
      local_428[0].val[0]._0_4_ = 0x1010000;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x2010000;
      local_338 = 0x1500000015;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&grayFrame;
      local_428[0].val[1] = (double)&grayFrame;
      cv::GaussianBlur(0,0,(_InputArray *)local_428,(_InputArray *)&predictedTrajectory,&local_338,4
                      );
      local_428[0].val[2] = 0.0;
      local_428[0].val[0]._0_4_ = 0x1010000;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_428[0].val[1] = (double)&firstFrame;
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x1010000;
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x2010000;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&grayFrame;
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&frameDelta;
      cv::absdiff((_InputArray *)local_428,(_InputArray *)&predictedTrajectory,
                  (_OutputArray *)&centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>);
      local_428[0].val[2] = 0.0;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_428[0].val[0]._0_4_ = 0x1010000;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x2010000;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&thresh;
      local_428[0].val[1] = (double)&frameDelta;
      cv::threshold((_InputArray *)local_428,(_OutputArray *)&predictedTrajectory,25.0,255.0,0);
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_448.sz.width = 0;
      local_448.sz.height = 0;
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x1010000;
      local_448.flags = 0x2010000;
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&thresh;
      local_448.obj = (pointer)&thresh;
      cv::Mat::Mat((Mat *)local_428);
      rect.x = 0x1010000;
      local_340 = 0xffffffffffffffff;
      rect._8_8_ = (_InputArray *)local_428;
      cv::Scalar_<double>::all((Scalar_<double> *)&predictedTrajectory,1.79769313486232e+308);
      in_stack_fffffffffffffb78 = (Scalar_<double> *)&predictedTrajectory;
      cv::dilate(&centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>,&local_448,&rect,
                 &local_340,2,0,(Scalar_<double> *)&predictedTrajectory);
      cv::Mat::~Mat((Mat *)local_428);
      local_428[0].val[2] = 0.0;
      local_428[0].val[0]._0_4_ = 0x1010000;
      local_428[0].val[1] = (double)&thresh;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x8204000c;
      local_348 = 0;
      in_R8 = &local_348;
      predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&contours;
      cv::findContours((_InputArray *)local_428,(Scalar_<double> *)&predictedTrajectory,0,2);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&predictedTrajectory,
                 ((long)contours.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)local_428
                );
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::vector(&local_228,&contours);
      getCenters((vector<BoxPoint,_std::allocator<BoxPoint>_> *)
                 &centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>,&local_228);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_228);
      if (centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pointer)CONCAT44(centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_)) {
        pvVar5 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at
                           ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)
                            &centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>,0);
        std::vector<BoxPoint,std::allocator<BoxPoint>>::emplace_back<BoxPoint&>
                  ((vector<BoxPoint,std::allocator<BoxPoint>> *)&initialTrajectory,pvVar5);
      }
      for (uVar9 = 0;
          uVar9 < (ulong)(((long)contours.
                                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)contours.
                                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar9 = uVar9 + 1) {
        local_428[0].val[1] =
             (double)std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::at(&contours,uVar9);
        local_428[0].val[2] = 0.0;
        local_428[0].val[0]._0_4_ = -0x7efcfff4;
        dVar10 = (double)cv::contourArea((_InputArray *)local_428,false);
        if (300.0 <= dVar10) {
          local_428[0].val[1] =
               (double)std::
                       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ::at(&contours,uVar9);
          local_428[0].val[2] = 0.0;
          local_428[0].val[0] = (double)CONCAT44(local_428[0].val[0]._4_4_,-0x7efcfff4);
          cv::boundingRect((_InputArray *)&rect);
          local_448.sz.width = 0;
          local_448.sz.height = 0;
          local_448.flags = 0x3010000;
          local_308[0] = CONCAT44(rect.y,rect.x);
          local_308[1]._0_4_ = rect.width;
          local_308[1]._4_4_ = rect.height;
          local_448.obj = (pointer)&frame;
          cv::Matx<double,_4,_1>::Matx(local_428);
          local_428[0].val[0] = 0.0;
          local_428[0].val[1] = 0.0;
          local_428[0].val[2] = 255.0;
          local_428[0].val[3] = 0.0;
          cv::rectangle(&local_448,local_308,(_InputArray *)local_428,1,8,0);
          local_448.sz.width = 0;
          local_448.sz.height = 0;
          local_448.flags = 0x3010000;
          local_448.obj = (pointer)&frame;
          pvVar5 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at
                             ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)
                              &centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>,uVar9
                             );
          dVar10 = pvVar5->x;
          pvVar5 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at
                             ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)
                              &centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>,uVar9
                             );
          local_350 = CONCAT44((int)pvVar5->z,(int)dVar10);
          cv::Matx<double,_4,_1>::Matx(local_428);
          local_428[0].val[0]._0_4_ = 0;
          local_428[0].val[0]._4_4_ = 0;
          local_428[0].val[1] = 0.0;
          local_428[0].val[2] = 255.0;
          local_428[0].val[3] = 0.0;
          in_stack_fffffffffffffb78 =
               (Scalar_<double> *)((ulong)in_stack_fffffffffffffb78 & 0xffffffff00000000);
          in_R8 = (undefined8 *)0x1;
          cv::circle(&local_448,&local_350,2,(_InputArray *)local_428,1,8,in_stack_fffffffffffffb78)
          ;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_428,"Camera",(allocator<char> *)&rect);
      local_448.sz.width = 0;
      local_448.sz.height = 0;
      local_448.flags = 0x1010000;
      local_448.obj = &frame;
      cv::imshow((string *)local_428,&local_448);
      std::__cxx11::string::~string((string *)local_428);
      cv::waitKey(0);
      iVar3 = cv::waitKey(1);
      std::_Vector_base<BoxPoint,_std::allocator<BoxPoint>_>::~_Vector_base
                (&centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>);
      std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
                ((_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                 &predictedTrajectory);
    } while (iVar3 != 0x1b);
    std::vector<BoxPoint,_std::allocator<BoxPoint>_>::vector
              ((vector<BoxPoint,_std::allocator<BoxPoint>_> *)&local_330,&initialTrajectory);
    getPredictedTrajectory
              (&predictedTrajectory,(vector<BoxPoint,_std::allocator<BoxPoint>_> *)&local_330,25.0,
               0.5);
    std::_Vector_base<BoxPoint,_std::allocator<BoxPoint>_>::~_Vector_base(&local_330);
    uVar9 = 0;
    while( true ) {
      uVar6 = (long)initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 5;
      if (((long)predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           CONCAT44(predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                    predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start._0_4_) >> 5) + uVar6 <= uVar9) break;
      this = &predictedTrajectory;
      if (uVar9 < uVar6) {
        this = &initialTrajectory;
      }
      uVar7 = 0;
      if (uVar9 >= uVar6) {
        uVar7 = uVar6;
      }
      pvVar5 = std::vector<BoxPoint,_std::allocator<BoxPoint>_>::at(this,uVar9 - uVar7);
      dVar10 = pvVar5->x;
      local_318 = pvVar5->yHeight;
      dStack_310 = pvVar5->yWidth;
      dVar1 = pvVar5->z;
      lVar8 = (long)initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      cv::Matx<double,_4,_1>::Matx(local_428);
      uVar11 = 0;
      if (uVar9 < (ulong)(lVar8 >> 5)) {
        local_428[0].val[0]._4_4_ = 0;
        uVar11 = 0x406fe000;
      }
      else {
        local_428[0].val[0]._4_4_ = 0x406fe000;
      }
      local_428[0].val[0]._0_4_ = 0;
      local_428[0].val[1] = 0.0;
      local_428[0].val[2] = (double)((ulong)uVar11 << 0x20);
      local_428[0].val[3] = 0.0;
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x3010000;
      in_stack_fffffffffffffb78 =
           (Scalar_<double> *)((ulong)in_stack_fffffffffffffb78 & 0xffffffff00000000);
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&lastFrame;
      local_390 = (int)dVar10;
      local_38c = -(int)dVar1;
      cv::circle(&centers,&local_390,2,local_428,1,8,in_stack_fffffffffffffb78);
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x3010000;
      local_2f0 = CONCAT44(-(int)dVar1 - (int)((double)(int)dStack_310 * 0.5),
                           (int)dVar10 - (int)((double)(int)local_318 * 0.5));
      uStack_2e8 = CONCAT44((int)dStack_310,(int)local_318);
      centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&lastFrame;
      cv::rectangle(&centers,&local_2f0,local_428,1,8,0);
      uVar9 = uVar9 + 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_428,"Predicted",(allocator<char> *)&local_448);
    centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0x1010000;
    centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)&lastFrame;
    cv::imshow((string *)local_428,(_InputArray *)&centers);
    std::__cxx11::string::~string((string *)local_428);
    cv::waitKey(0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_428,"output.jpg",(allocator<char> *)&rect);
    centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0x1010000;
    local_448.flags = 0;
    local_448._4_4_ = 0;
    local_448.obj = (void *)0x0;
    local_448.sz.width = 0;
    local_448.sz.height = 0;
    centers.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)&lastFrame;
    cv::imwrite((string *)local_428,(_InputArray *)&centers,(vector *)&local_448);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_448);
    std::__cxx11::string::~string((string *)local_428);
    std::_Vector_base<BoxPoint,_std::allocator<BoxPoint>_>::~_Vector_base
              (&predictedTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>);
    std::_Vector_base<BoxPoint,_std::allocator<BoxPoint>_>::~_Vector_base
              (&initialTrajectory.super__Vector_base<BoxPoint,_std::allocator<BoxPoint>_>);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector(&contours);
    cv::Mat::~Mat(&lastFrame);
    cv::Mat::~Mat(&thresh);
    cv::Mat::~Mat(&frameDelta);
    cv::Mat::~Mat(&grayFrame);
    cv::Mat::~Mat(&frame);
    cv::Mat::~Mat(&firstFrame);
    cv::VideoCapture::~VideoCapture(&vid);
    std::__cxx11::string::~string((string *)&videoFile);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){
    
    if(argc <= 1){
        std::cerr << "Requires 1 Argument" << std::endl;
    }else{
        std::string videoFile = argv[1];
    
        int minContourArea = 300;
        cv::VideoCapture vid = cv::VideoCapture(videoFile);
        cv::Mat firstFrame, frame, grayFrame, frameDelta, thresh, lastFrame;
        std::vector<std::vector<cv::Point>> contours;
        vid.read(frame);
        lastFrame = frame.clone();
        cv::cvtColor(frame, firstFrame, cv::COLOR_BGR2GRAY);
        cv::GaussianBlur(firstFrame, firstFrame, cv::Size(21, 21), 0);


        std::vector<BoxPoint> initialTrajectory;
        
        while(vid.read(frame)){
            lastFrame = frame.clone();
            cv::cvtColor(frame, grayFrame, cv::COLOR_BGR2GRAY); 
            cv::GaussianBlur(grayFrame, grayFrame, cv::Size(21, 21), 0);
            cv::absdiff(firstFrame, grayFrame, frameDelta);
            cv::threshold(frameDelta, thresh, 25, 255, cv::THRESH_BINARY);
            cv::dilate(thresh, thresh, cv::Mat(), cv::Point(-1, -1), 2);
            cv::findContours(thresh, contours, cv::RETR_EXTERNAL, cv::CHAIN_APPROX_SIMPLE);
            
            std::vector<cv::Rect> boundingRect{contours.size()};
            std::vector<BoxPoint> centers = getCenters(contours);
            if(centers.size() > 0){
                initialTrajectory.emplace_back(centers.at(0));
            };
            
            for(size_t i=0; i<contours.size(); i++){
                if(cv::contourArea(contours.at(i)) < minContourArea){ continue; }
          
                cv::Rect rect = cv::boundingRect(contours.at(i));
                cv::rectangle(frame, rect, cv::Scalar(0, 0, 255), 1);

                cv::circle(frame, cv::Point{(int) centers.at(i).x, (int) centers.at(i).z}, 2, cv::Scalar(0, 0, 255));
            }
            
            cv::imshow("Camera", frame);
            cv::waitKey(0);
            if(cv::waitKey(1) == 27){
                break;
            }

        }

        std::vector<BoxPoint> predictedTrajectory = getPredictedTrajectory(initialTrajectory, 25.0, 0.50);
        for(size_t i=0; i<initialTrajectory.size()+predictedTrajectory.size(); i++){
            BoxPoint point = i < initialTrajectory.size() ? initialTrajectory.at(i) : predictedTrajectory.at(i-initialTrajectory.size());
            cv::Scalar color = i < initialTrajectory.size() ? cv::Scalar(0, 0, 255) : cv::Scalar(255, 0, 0);
                    
            cv::Point centerPoint{(int) point.x, -1 * (int) point.z};
            cv::Size boxSize = cv::Size{(int) point.yHeight, (int) point.yWidth};
            cv::Point boxStart{
                centerPoint.x - (int)(0.5*boxSize.width),
                centerPoint.y - (int)(0.5*boxSize.height)};
            cv::Rect box{boxStart, boxSize}; 

            cv::circle(lastFrame, centerPoint, 2, color);
            cv::rectangle(lastFrame, box, color);
        };
        cv::imshow("Predicted", lastFrame);
        cv::waitKey(0); 
        cv::imwrite("output.jpg", lastFrame);
    }
}